

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
V2Transport::V2Transport
          (V2Transport *this,NodeId nodeid,bool initiating,CKey *key,Span<const_std::byte> ent32,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *garbage)

{
  pointer puVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  unique_lock<std::mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__V2Transport_01142040;
  BIP324Cipher::BIP324Cipher(&this->m_cipher,key,ent32);
  this->m_initiating = initiating;
  this->m_nodeid = nodeid;
  V1Transport::V1Transport(&this->m_v1_fallback,nodeid);
  *(undefined8 *)
   ((long)&(this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev + 4) =
       0;
  *(undefined8 *)
   ((long)&(this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next + 4) =
       0;
  *(undefined8 *)((long)&(this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recv_decode_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recv_decode_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recv_decode_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_recv_state = initiating;
  (this->m_send_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_send_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_send_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_send_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_send_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->m_send_pos = 0;
  (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (garbage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (garbage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (garbage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (garbage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (garbage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (garbage->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_send_type)._M_dataplus._M_p = (pointer)&(this->m_send_type).field_2;
  (this->m_send_type)._M_string_length = 0;
  (this->m_send_type).field_2._M_local_buf[0] = '\0';
  this->m_send_state = initiating;
  this->m_sent_v1_header_worth = false;
  if ((int)CONCAT71(in_register_00000011,initiating) != 0) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_38,&this->m_send_mutex,
               "m_send_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
               ,0x3d6,false);
    StartSendingHandshake(this);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

V2Transport::V2Transport(NodeId nodeid, bool initiating, const CKey& key, Span<const std::byte> ent32, std::vector<uint8_t> garbage) noexcept
    : m_cipher{key, ent32}, m_initiating{initiating}, m_nodeid{nodeid},
      m_v1_fallback{nodeid},
      m_recv_state{initiating ? RecvState::KEY : RecvState::KEY_MAYBE_V1},
      m_send_garbage{std::move(garbage)},
      m_send_state{initiating ? SendState::AWAITING_KEY : SendState::MAYBE_V1}
{
    Assume(m_send_garbage.size() <= MAX_GARBAGE_LEN);
    // Start sending immediately if we're the initiator of the connection.
    if (initiating) {
        LOCK(m_send_mutex);
        StartSendingHandshake();
    }
}